

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void basisu::vector<basist::ktx2_level_index>::object_mover
               (void *pDst_void,void *pSrc_void,uint32_t num)

{
  long lVar1;
  
  for (lVar1 = 0; (ulong)num * 0x18 - lVar1 != 0; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)pDst_void + lVar1) = *pSrc_void;
    *(undefined8 *)((long)pDst_void + lVar1 + 8) = *(undefined8 *)((long)pSrc_void + 8);
    *(undefined8 *)((long)pDst_void + lVar1 + 0x10) = *(undefined8 *)((long)pSrc_void + 0x10);
    pSrc_void = (void *)((long)pSrc_void + 0x18);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }